

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

void __thiscall glslang::TFunction::addParameter(TFunction *this,TParameter *p)

{
  pointer *ppTVar1;
  iterator __position;
  TType *pTVar2;
  
  if ((this->super_TSymbol).writable != false) {
    __position._M_current =
         (this->parameters).
         super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
         super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->parameters).
        super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
        super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<glslang::TParameter,glslang::pool_allocator<glslang::TParameter>>::
      _M_realloc_insert<glslang::TParameter_const&>
                ((vector<glslang::TParameter,glslang::pool_allocator<glslang::TParameter>> *)
                 &this->parameters,__position,p);
    }
    else {
      (__position._M_current)->defaultValue = p->defaultValue;
      pTVar2 = p->type;
      (__position._M_current)->name = p->name;
      (__position._M_current)->type = pTVar2;
      ppTVar1 = &(this->parameters).
                 super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
                 super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
    TType::buildMangledName(p->type,&this->mangledName);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    push_back(&this->mangledName,';');
    if (p->defaultValue != (TIntermTyped *)0x0) {
      this->defaultParamCount = this->defaultParamCount + 1;
    }
    return;
  }
  __assert_fail("writable",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                ,0x10e,"virtual void glslang::TFunction::addParameter(TParameter &)");
}

Assistant:

virtual void addParameter(TParameter& p)
    {
        assert(writable);
        parameters.push_back(p);
        p.type->appendMangledName(mangledName);

        if (p.defaultValue != nullptr)
            defaultParamCount++;
    }